

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O0

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSidInInstance
          (DocumentProcessor *this,SidTreeNode *instancingElement,SidAddress *sidAddress,
          size_t firstSidIndex)

{
  TargetTypeClass TVar1;
  int iVar2;
  MemberSelection memberSelection;
  undefined4 extraout_var;
  SidList *this_00;
  SidAddress *sidAddress_00;
  size_t sVar3;
  SidAddress *in_RCX;
  SidAddress *in_RDX;
  SidTreeNode *in_RSI;
  size_t i;
  size_t allSidsCount;
  SidList *allSids;
  SidAddress newSidAddress;
  KinematicInstance *ki;
  IntermediateTargetable *iTargetable;
  URI *uri;
  String *in_stack_fffffffffffffed8;
  SidAddress *in_stack_fffffffffffffee0;
  URI *in_stack_ffffffffffffff18;
  SidAddress *in_stack_ffffffffffffff20;
  DocumentProcessor *in_stack_ffffffffffffff28;
  SidAddress local_c0;
  KinematicInstance *local_40;
  IntermediateTargetable *local_38;
  URI *local_30;
  SidAddress *local_28;
  SidAddress *local_20;
  SidTreeNode *local_18;
  SidTreeNode *local_8;
  
  local_30 = (URI *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  TVar1 = SidTreeNode::getTargetType(in_RSI);
  if (TVar1 == TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
    local_38 = SidTreeNode::getIntermediateTargetableTarget(local_18);
    iVar2 = (*local_38->_vptr_IntermediateTargetable[2])();
    if (CONCAT44(extraout_var,iVar2) == 1) {
      local_40 = intermediateTargetableSafeCast<COLLADASaxFWL::KinematicInstance>
                           ((IntermediateTargetable *)in_stack_fffffffffffffed8);
      local_30 = KinematicInstance::getUrl(local_40);
    }
  }
  if (local_30 == (URI *)0x0) {
    local_8 = (SidTreeNode *)0x0;
  }
  else {
    SidAddress::SidAddress(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    this_00 = SidAddress::getSids_abi_cxx11_(local_20);
    sidAddress_00 =
         (SidAddress *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(this_00);
    for (; local_28 < sidAddress_00;
        local_28 = (SidAddress *)((long)&local_28->_vptr_SidAddress + 1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_00,(size_type)local_28);
      SidAddress::appendSid(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    sVar3 = SidAddress::getFirstIndex(local_20);
    SidAddress::setFirstIndex(&local_c0,sVar3);
    sVar3 = SidAddress::getSecondIndex(local_20);
    SidAddress::setSecondIndex(&local_c0,sVar3);
    memberSelection = SidAddress::getMemberSelection(local_20);
    SidAddress::setMemberSelection(&local_c0,memberSelection);
    SidAddress::getMemberSelectionName_abi_cxx11_(local_20);
    SidAddress::setMemberSelectionName(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_8 = resolveSid(in_stack_ffffffffffffff28,sidAddress_00);
    SidAddress::~SidAddress((SidAddress *)local_8);
  }
  return local_8;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSidInInstance( const SidTreeNode* instancingElement, const SidAddress& sidAddress,  size_t firstSidIndex)
	{
		// the sid address we use to resolve the sid in the instantiated element
		const COLLADABU::URI* uri = 0;

		//check if instancingElement instantiates an element
		switch ( instancingElement->getTargetType() )
		{
		case SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE:
			{
				IntermediateTargetable* iTargetable = instancingElement->getIntermediateTargetableTarget();
				switch ( iTargetable->getClassId() )
				{
				case INTERMEDIATETARGETABLE_TYPE::KINEMATICS_INSTANCE:
					{
						KinematicInstance* ki = intermediateTargetableSafeCast<KinematicInstance>(iTargetable);
						uri = &ki->getUrl();
						break;
					}
				}

			}
			// 		case SidTreeNode::TARGETTYPECLASS_OBJECT:
			// 			{
			// 				COLLADAFW::Object* iObject = instancingElement->getObjectTarget();
			// 				switch ( iObject->getClassId() )
			// 				{
			// 				case COLLADAFW::COLLADA_TYPE::JOINT:
			// 					{
			// 						KinematicInstance* ki = (KinematicInstance*) iObject;
			// 						uri = &ki->getUrl();
			// 					}
			// 				}
			// 			}
        default:
            break;
		}

		if ( !uri )
		{
			// we could not find an instantiated element
			return 0;
		}

		SidAddress newSidAddress( *uri );
		const SidAddress::SidList& allSids = sidAddress.getSids();
		size_t allSidsCount = allSids.size();
		for ( size_t i = firstSidIndex; i < allSidsCount; ++i)
		{
			newSidAddress.appendSid( allSids[i] );
		}	
		newSidAddress.setFirstIndex( sidAddress.getFirstIndex() );
		newSidAddress.setSecondIndex( sidAddress.getSecondIndex() );
		newSidAddress.setMemberSelection( sidAddress.getMemberSelection() );
		newSidAddress.setMemberSelectionName( sidAddress.getMemberSelectionName() );
		return resolveSid( newSidAddress );
	}